

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void __thiscall DCanvas::Dim(DCanvas *this,PalEntry color,float damount,int x1,int y1,int w,int h)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  DWORD bg;
  int amount;
  int y;
  int x;
  BYTE *spot;
  int gap;
  DWORD fg;
  DWORD *bg2rgb;
  int local_28;
  int h_local;
  int w_local;
  int y1_local;
  int x1_local;
  float damount_local;
  DCanvas *this_local;
  PalEntry color_local;
  
  if ((((damount != 0.0) || (NAN(damount))) && (x1 < this->Width)) && (y1 < this->Height)) {
    local_28 = w;
    if (this->Width < x1 + w) {
      local_28 = this->Width - x1;
    }
    bg2rgb._4_4_ = h;
    if (this->Height < y1 + h) {
      bg2rgb._4_4_ = this->Height - y1;
    }
    if ((0 < local_28) && (0 < (int)bg2rgb._4_4_)) {
      iVar3 = (int)(damount * 64.0);
      _y = this->Buffer + (long)(y1 * this->Pitch) + (long)x1;
      iVar1 = this->Pitch;
      for (bg = bg2rgb._4_4_; bg != 0; bg = bg - 1) {
        for (amount = local_28; amount != 0; amount = amount + -1) {
          uVar2 = (((int)(((uint)color.field_0 >> 0x10 & 0xff) * iVar3) >> 4) << 0x14 |
                   (int)(((uint)color.field_0 >> 8 & 0xff) * iVar3) >> 4 |
                  ((int)(((uint)color.field_0 & 0xff) * iVar3) >> 4) << 10) +
                  Col2RGB8[0x40 - iVar3][(int)(uint)*_y] | 0x1f07c1f;
          *_y = RGB32k.All[uVar2 & uVar2 >> 0xf];
          _y = _y + 1;
        }
        _y = _y + (iVar1 - local_28);
      }
    }
  }
  return;
}

Assistant:

void DCanvas::Dim (PalEntry color, float damount, int x1, int y1, int w, int h)
{
	if (damount == 0.f)
		return;

	DWORD *bg2rgb;
	DWORD fg;
	int gap;
	BYTE *spot;
	int x, y;

	if (x1 >= Width || y1 >= Height)
	{
		return;
	}
	if (x1 + w > Width)
	{
		w = Width - x1;
	}
	if (y1 + h > Height)
	{
		h = Height - y1;
	}
	if (w <= 0 || h <= 0)
	{
		return;
	}

	{
		int amount;

		amount = (int)(damount * 64);
		bg2rgb = Col2RGB8[64-amount];

		fg = (((color.r * amount) >> 4) << 20) |
			  ((color.g * amount) >> 4) |
			 (((color.b * amount) >> 4) << 10);
	}

	spot = Buffer + x1 + y1*Pitch;
	gap = Pitch - w;
	for (y = h; y != 0; y--)
	{
		for (x = w; x != 0; x--)
		{
			DWORD bg;

			bg = bg2rgb[(*spot)&0xff];
			bg = (fg+bg) | 0x1f07c1f;
			*spot = RGB32k.All[bg&(bg>>15)];
			spot++;
		}
		spot += gap;
	}
}